

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KinDynComputations.cpp
# Opt level: O3

bool __thiscall
iDynTree::KinDynComputations::setFrameVelocityRepresentation
          (KinDynComputations *this,FrameVelocityRepresentation frameVelRepr)

{
  KinDynComputationsPrivateAttributes *pKVar1;
  
  if (frameVelRepr < (MIXED_REPRESENTATION|BODY_FIXED_REPRESENTATION)) {
    pKVar1 = this->pimpl;
    if (pKVar1->m_frameVelRepr != frameVelRepr) {
      pKVar1->m_areBiasAccelerationsUpdated = false;
    }
    pKVar1->m_frameVelRepr = frameVelRepr;
  }
  else {
    iDynTree::reportError
              ("KinDynComputations","setFrameVelocityRepresentation",
               "unknown frame velocity representation");
  }
  return frameVelRepr < (MIXED_REPRESENTATION|BODY_FIXED_REPRESENTATION);
}

Assistant:

bool KinDynComputations::setFrameVelocityRepresentation(const FrameVelocityRepresentation frameVelRepr) const
{
    if( frameVelRepr != INERTIAL_FIXED_REPRESENTATION &&
        frameVelRepr != BODY_FIXED_REPRESENTATION &&
        frameVelRepr != MIXED_REPRESENTATION )
    {
        reportError("KinDynComputations","setFrameVelocityRepresentation","unknown frame velocity representation");
        return false;
    }

    // If there is a change in FrameVelocityRepresentation, we should also invalidate the bias acceleration cache, as
    // the bias acceleration depends on the frameVelRepr even if it is always expressed in body fixed representation.
    // All the other cache are fine because they are always stored in BODY_FIXED, and they do not depend on the frameVelRepr,
    // as they are converted on the fly when the relative retrieval method is called.
    if (frameVelRepr != pimpl->m_frameVelRepr)
    {
        this->pimpl->m_areBiasAccelerationsUpdated = false;
    }

    pimpl->m_frameVelRepr = frameVelRepr;
    return true;
}